

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByPrintableName
          (DescriptorPool *this,Descriptor *extendee,string *printable_name)

{
  long lVar1;
  uint uVar2;
  Type TVar3;
  FieldDescriptor *pFVar4;
  Descriptor *pDVar5;
  Descriptor *pDVar6;
  long lVar7;
  
  if (*(int *)(extendee + 0x78) != 0) {
    pFVar4 = FindExtensionByName(this,printable_name);
    if ((pFVar4 != (FieldDescriptor *)0x0) && (*(Descriptor **)(pFVar4 + 0x50) == extendee)) {
      return pFVar4;
    }
    if ((*(char *)(*(long *)(extendee + 0x20) + 0x48) == '\x01') &&
       (pDVar5 = FindMessageTypeByName(this,printable_name), pDVar5 != (Descriptor *)0x0)) {
      uVar2 = *(uint *)(pDVar5 + 0x7c);
      if ((int)*(uint *)(pDVar5 + 0x7c) < 1) {
        uVar2 = 0;
      }
      for (lVar7 = 0; (ulong)uVar2 * 0x98 - lVar7 != 0; lVar7 = lVar7 + 0x98) {
        lVar1 = *(long *)(pDVar5 + 0x50);
        if (*(Descriptor **)(lVar1 + 0x50 + lVar7) == extendee) {
          pFVar4 = (FieldDescriptor *)(lVar1 + lVar7);
          TVar3 = FieldDescriptor::type(pFVar4);
          if (((TVar3 == TYPE_MESSAGE) && (*(int *)(lVar1 + 0x3c + lVar7) == 1)) &&
             (pDVar6 = FieldDescriptor::message_type(pFVar4), pDVar6 == pDVar5)) {
            return pFVar4;
          }
        }
      }
    }
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByPrintableName(
    const Descriptor* extendee, const std::string& printable_name) const {
  if (extendee->extension_range_count() == 0) return nullptr;
  const FieldDescriptor* result = FindExtensionByName(printable_name);
  if (result != nullptr && result->containing_type() == extendee) {
    return result;
  }
  if (extendee->options().message_set_wire_format()) {
    // MessageSet extensions may be identified by type name.
    const Descriptor* type = FindMessageTypeByName(printable_name);
    if (type != nullptr) {
      // Look for a matching extension in the foreign type's scope.
      const int type_extension_count = type->extension_count();
      for (int i = 0; i < type_extension_count; i++) {
        const FieldDescriptor* extension = type->extension(i);
        if (extension->containing_type() == extendee &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() && extension->message_type() == type) {
          // Found it.
          return extension;
        }
      }
    }
  }
  return nullptr;
}